

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_kneip::sPolynomial53
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *this;
  Index in_stack_fffffffffffffdd8;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *in_stack_fffffffffffffde0;
  
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,0x1061df6);
  row = -*pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (in_stack_fffffffffffffde0,(Index)row,0x1061e2d);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)(row / *pSVar3);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061e53);
  *pSVar3 = (Scalar)this;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061e74);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061eac);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061ed3);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061ef4);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061f2c);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061f53);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061f74);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061fac);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061fd1);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1061ff2);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106202a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062051);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062072);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10620aa);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10620d1);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10620f2);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106212a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062151);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062172);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062193);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10621ba);
  *pSVar3 = dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10621db);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062216);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062243);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062267);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10622a2);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10622cf);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10622f3);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106232e);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106235b);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106237f);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10623ba);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10623e7);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106240b);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062446);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062473);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062497);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10624d2);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10624ff);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062523);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062547);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062574);
  *pSVar3 = dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062598);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10625d3);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062600);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062624);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106265f);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106268c);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10626b0);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10626eb);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062718);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106273c);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062777);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10627a4);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10627c8);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062803);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062830);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062854);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106288f);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10628bc);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10628e0);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106291b);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062948);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106296c);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10629a7);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10629d4);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10629f8);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062a33);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062a60);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062a84);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062abf);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062aec);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062b10);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062b4b);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062b78);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062b9c);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062bd7);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062c04);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062c28);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062c63);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062c90);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062cb4);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062cef);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062d1c);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062d40);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062d7b);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062da8);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062dcc);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062e07);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062e34);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062e58);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062e93);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062ec0);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062ee4);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062f1f);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062f4c);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062f70);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062fab);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1062fd8);
  *pSVar3 = -dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::sPolynomial53( Eigen::Matrix<double,66,197> & groebnerMatrix )
{
  groebnerMatrix(53,50) = -groebnerMatrix(32,156)/(groebnerMatrix(32,155));
  groebnerMatrix(53,51) = -groebnerMatrix(32,157)/(groebnerMatrix(32,155));
  groebnerMatrix(53,52) = -groebnerMatrix(32,158)/(groebnerMatrix(32,155));
  groebnerMatrix(53,53) = -groebnerMatrix(32,159)/(groebnerMatrix(32,155));
  groebnerMatrix(53,54) = -groebnerMatrix(32,160)/(groebnerMatrix(32,155));
  groebnerMatrix(53,55) = -groebnerMatrix(32,161)/(groebnerMatrix(32,155));
  groebnerMatrix(53,56) = -groebnerMatrix(32,162)/(groebnerMatrix(32,155));
  groebnerMatrix(53,75) = groebnerMatrix(11,174)/(groebnerMatrix(11,166));
  groebnerMatrix(53,82) = -groebnerMatrix(32,170)/(groebnerMatrix(32,155));
  groebnerMatrix(53,83) = -groebnerMatrix(32,171)/(groebnerMatrix(32,155));
  groebnerMatrix(53,85) = -groebnerMatrix(32,173)/(groebnerMatrix(32,155));
  groebnerMatrix(53,86) = -groebnerMatrix(32,174)/(groebnerMatrix(32,155));
  groebnerMatrix(53,88) = -groebnerMatrix(32,176)/(groebnerMatrix(32,155));
  groebnerMatrix(53,95) = -groebnerMatrix(32,177)/(groebnerMatrix(32,155));
  groebnerMatrix(53,116) = groebnerMatrix(11,183)/(groebnerMatrix(11,166));
  groebnerMatrix(53,118) = -groebnerMatrix(32,178)/(groebnerMatrix(32,155));
  groebnerMatrix(53,119) = -groebnerMatrix(32,179)/(groebnerMatrix(32,155));
  groebnerMatrix(53,120) = -groebnerMatrix(32,180)/(groebnerMatrix(32,155));
  groebnerMatrix(53,121) = -groebnerMatrix(32,181)/(groebnerMatrix(32,155));
  groebnerMatrix(53,122) = -groebnerMatrix(32,182)/(groebnerMatrix(32,155));
  groebnerMatrix(53,123) = -groebnerMatrix(32,183)/(groebnerMatrix(32,155));
  groebnerMatrix(53,124) = -groebnerMatrix(32,184)/(groebnerMatrix(32,155));
  groebnerMatrix(53,131) = -groebnerMatrix(32,185)/(groebnerMatrix(32,155));
  groebnerMatrix(53,139) = -groebnerMatrix(32,186)/(groebnerMatrix(32,155));
  groebnerMatrix(53,163) = -groebnerMatrix(32,187)/(groebnerMatrix(32,155));
  groebnerMatrix(53,164) = -groebnerMatrix(32,188)/(groebnerMatrix(32,155));
  groebnerMatrix(53,165) = -groebnerMatrix(32,189)/(groebnerMatrix(32,155));
  groebnerMatrix(53,166) = -groebnerMatrix(32,190)/(groebnerMatrix(32,155));
  groebnerMatrix(53,167) = -groebnerMatrix(32,191)/(groebnerMatrix(32,155));
  groebnerMatrix(53,168) = -groebnerMatrix(32,192)/(groebnerMatrix(32,155));
  groebnerMatrix(53,169) = -groebnerMatrix(32,193)/(groebnerMatrix(32,155));
  groebnerMatrix(53,176) = -groebnerMatrix(32,194)/(groebnerMatrix(32,155));
  groebnerMatrix(53,184) = -groebnerMatrix(32,195)/(groebnerMatrix(32,155));
  groebnerMatrix(53,193) = -groebnerMatrix(32,196)/(groebnerMatrix(32,155));
}